

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExtractor.h
# Opt level: O1

void __thiscall
llvm::DataExtractor::getU8
          (DataExtractor *this,Cursor *C,SmallVectorImpl<unsigned_char> *Dst,uint32_t Count)

{
  ulong uVar1;
  ulong N;
  
  uVar1 = C->Offset;
  N = (ulong)Count;
  if ((uVar1 <= uVar1 + N) && ((uVar1 + N) - 1 < (this->Data).Length)) {
    SmallVectorImpl<unsigned_char>::resize(Dst,N);
  }
  getU8(this,C,(uint8_t *)
               (Dst->super_SmallVectorTemplateBase<unsigned_char,_true>).
               super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.BeginX,
        Count);
  return;
}

Assistant:

void getU8(Cursor &C, SmallVectorImpl<uint8_t> &Dst, uint32_t Count) const {
    if (isValidOffsetForDataOfSize(C.Offset, Count))
      Dst.resize(Count);

    // This relies on the fact that getU8 will not attempt to write to the
    // buffer if isValidOffsetForDataOfSize(C.Offset, Count) is false.
    getU8(C, Dst.data(), Count);
  }